

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

size_t __thiscall
CVmObjGramProd::build_alt_props_list(CVmObjGramProd *this,vm_obj_id_t match_obj,CVmObjList *lst)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  long *plVar5;
  vm_prop_id_t *pvVar6;
  size_t idx;
  ulong uVar7;
  vm_val_t v;
  vm_val_t local_40;
  
  pcVar2 = (this->super_CVmObject).ext_;
  if (*(long *)(pcVar2 + 0x38) == 0) {
    idx = 0;
  }
  else {
    plVar5 = *(long **)(pcVar2 + 0x30);
    idx = 0;
    uVar7 = 0;
    do {
      lVar1 = *plVar5;
      if (((*(int *)(lVar1 + 8) == 0) && (*(vm_obj_id_t *)(lVar1 + 0xc) == match_obj)) &&
         (uVar3 = *(ulong *)(lVar1 + 0x18), uVar3 != 0)) {
        pvVar6 = *(vm_prop_id_t **)(lVar1 + 0x10);
        uVar4 = 0;
        do {
          local_40.val.prop = *pvVar6;
          if (local_40.val.prop != 0) {
            if (lst != (CVmObjList *)0x0) {
              local_40.typ = VM_PROP;
              CVmObjList::cons_set_element(lst,idx,&local_40);
              uVar3 = *(ulong *)(lVar1 + 0x18);
            }
            idx = idx + 1;
          }
          uVar4 = uVar4 + 1;
          pvVar6 = pvVar6 + 0x10;
        } while (uVar4 < uVar3);
        pcVar2 = (this->super_CVmObject).ext_;
      }
      uVar7 = uVar7 + 1;
      plVar5 = plVar5 + 1;
    } while (uVar7 < *(ulong *)(pcVar2 + 0x38));
  }
  return idx;
}

Assistant:

size_t CVmObjGramProd::build_alt_props_list(
    VMG_ vm_obj_id_t match_obj, CVmObjList *lst)
{
    /* we haven't stored any properties yet */
    size_t n = 0;
    
    /* run through the surviving alternatives */
    vmgram_alt_info **alts = get_ext()->alts_;
    for (size_t i = 0 ; i < get_ext()->alt_cnt_ ; ++i, ++alts)
    {
        /* 
         *   if this alternative isn't being deleted, and it's associated
         *   with the given match object, add its properties to the list 
         */
        vmgram_alt_info *alt = *alts;
        if (!alt->del && alt->proc_obj == match_obj)
        {
            /* scan its token list */
            vmgram_tok_info *tok = alt->toks;
            for (size_t j = 0 ; j < alt->tok_cnt ; ++j, ++tok)
            {
                /* if this token has a target property, add it to the list */
                if (tok->prop != VM_INVALID_PROP)
                {
                    /* if we have a list, store it */
                    if (lst != 0)
                    {
                        vm_val_t v;
                        v.set_propid(tok->prop);
                        lst->cons_set_element(n, &v);
                    }
                    
                    /* count it */
                    ++n;
                }
            }
        }
    }

    /* return the number of properties we stored */
    return n;
}